

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O1

void __thiscall Assimp::M3DImporter::importAnimations(M3DImporter *this,M3DWrapper *m3d)

{
  undefined8 *puVar1;
  M3D_INDEX MVar2;
  m3da_t *pmVar3;
  m3db_t *pmVar4;
  m3dfr_t *pmVar5;
  m3dtr_t *pmVar6;
  m3dv_t *pmVar7;
  double dVar8;
  long *plVar9;
  long lVar10;
  uint uVar11;
  Logger *this_00;
  aiAnimation **ppaVar12;
  m3d_t *pmVar13;
  aiAnimation *paVar14;
  aiNodeAnim **ppaVar15;
  aiNodeAnim *paVar16;
  aiVectorKey *paVar17;
  aiQuatKey *paVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  aiQuatKey *paVar22;
  size_t sVar23;
  ulong uVar24;
  long lVar25;
  allocator<char> local_481;
  long *local_480;
  ulong local_478;
  long local_470 [2];
  M3DImporter *local_460;
  m3da_t *local_458;
  char *local_450;
  long local_448;
  ulong local_440;
  undefined1 local_438 [1032];
  
  local_460 = this;
  if (this->mScene == (aiScene *)0x0) {
    __assert_fail("mScene != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x205,"void Assimp::M3DImporter::importAnimations(const M3DWrapper &)");
  }
  if (m3d->m3d_ != (m3d_t *)0x0) {
    this->mScene->mNumAnimations = m3d->m3d_->numaction;
    this_00 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[23]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
               (char (*) [23])"M3D: importAnimations ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_438);
    std::__cxx11::stringbuf::str();
    Logger::debug(this_00,(char *)local_480);
    if (local_480 != local_470) {
      operator_delete(local_480,local_470[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
    std::ios_base::~ios_base((ios_base *)(local_438 + 0x70));
    uVar24 = (ulong)m3d->m3d_->numaction;
    if ((uVar24 != 0) && (m3d->m3d_->numbone != 0)) {
      ppaVar12 = (aiAnimation **)operator_new__(uVar24 << 3);
      local_460->mScene->mAnimations = ppaVar12;
      pmVar13 = m3d->m3d_;
      if (pmVar13->numaction != 0) {
        uVar24 = 0;
        do {
          pmVar3 = pmVar13->action;
          local_440 = uVar24;
          paVar14 = (aiAnimation *)operator_new(0x448);
          (paVar14->mName).length = 0;
          local_450 = (paVar14->mName).data;
          (paVar14->mName).data[0] = '\0';
          memset((paVar14->mName).data + 1,0x1b,0x3ff);
          paVar14->mDuration = -1.0;
          paVar14->mTicksPerSecond = 0.0;
          paVar14->mNumChannels = 0;
          paVar14->mChannels = (aiNodeAnim **)0x0;
          paVar14->mNumMeshChannels = 0;
          paVar14->mMeshChannels = (aiMeshAnim **)0x0;
          paVar14->mNumMorphMeshChannels = 0;
          paVar14->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
          local_458 = pmVar3;
          local_448 = uVar24 * 3;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_480,pmVar3[uVar24].name,&local_481);
          plVar9 = local_480;
          sVar23 = local_478 & 0xffffffff;
          if ((local_478 & 0xfffffc00) != 0) {
            sVar23 = 0x3ff;
          }
          local_438._0_4_ = (ai_uint32)sVar23;
          memcpy(local_438 + 4,local_480,sVar23);
          local_438[sVar23 + 4] = 0;
          (paVar14->mName).length = (ai_uint32)sVar23;
          memcpy(local_450,local_438 + 4,sVar23);
          (paVar14->mName).data[sVar23] = '\0';
          if (plVar9 != local_470) {
            operator_delete(plVar9,local_470[0] + 1);
          }
          lVar10 = local_448;
          pmVar3 = local_458;
          paVar14->mDuration = (double)(&local_458->durationmsec)[local_448 * 2] / 10.0;
          paVar14->mTicksPerSecond = 100.0;
          uVar11 = m3d->m3d_->numbone;
          paVar14->mNumChannels = uVar11;
          ppaVar15 = (aiNodeAnim **)operator_new__((ulong)uVar11 << 3);
          paVar14->mChannels = ppaVar15;
          if (m3d->m3d_->numbone != 0) {
            uVar24 = 0;
            do {
              paVar16 = (aiNodeAnim *)operator_new(0x438);
              (paVar16->mNodeName).length = 0;
              (paVar16->mNodeName).data[0] = '\0';
              memset((paVar16->mNodeName).data + 1,0x1b,0x3ff);
              paVar16->mRotationKeys = (aiQuatKey *)0x0;
              paVar16->mNumScalingKeys = 0;
              *(undefined8 *)&paVar16->mNumPositionKeys = 0;
              *(undefined8 *)((long)&paVar16->mPositionKeys + 4) = 0;
              paVar16->mScalingKeys = (aiVectorKey *)0x0;
              paVar16->mPreState = aiAnimBehaviour_DEFAULT;
              paVar16->mPostState = aiAnimBehaviour_DEFAULT;
              paVar14->mChannels[uVar24] = paVar16;
              local_458 = (m3da_t *)(uVar24 * 0x68);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_480,m3d->m3d_->bone[uVar24].name,&local_481);
              sVar23 = local_478 & 0xffffffff;
              if ((local_478 & 0xfffffc00) != 0) {
                sVar23 = 0x3ff;
              }
              local_438._0_4_ = (ai_uint32)sVar23;
              memcpy(local_438 + 4,local_480,sVar23);
              local_438[sVar23 + 4] = 0;
              paVar16 = paVar14->mChannels[uVar24];
              (paVar16->mNodeName).length = (ai_uint32)sVar23;
              memcpy((paVar16->mNodeName).data,local_438 + 4,sVar23);
              (paVar16->mNodeName).data[sVar23] = '\0';
              if (local_480 != local_470) {
                operator_delete(local_480,local_470[0] + 1);
              }
              MVar2 = (&pmVar3->numframe)[lVar10 * 2];
              paVar14->mChannels[uVar24]->mNumRotationKeys = MVar2;
              paVar14->mChannels[uVar24]->mNumPositionKeys = MVar2;
              uVar11 = (&pmVar3->numframe)[lVar10 * 2];
              uVar20 = (ulong)uVar11 * 0x18;
              paVar17 = (aiVectorKey *)operator_new__(uVar20);
              if ((ulong)uVar11 != 0) {
                uVar19 = 0;
                do {
                  puVar1 = (undefined8 *)((long)&paVar17->mTime + uVar19);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                  *(undefined4 *)((long)&(paVar17->mValue).z + uVar19) = 0;
                  uVar19 = uVar19 + 0x18;
                } while (uVar20 != uVar19);
              }
              paVar14->mChannels[uVar24]->mPositionKeys = paVar17;
              uVar20 = (ulong)(&pmVar3->numframe)[lVar10 * 2];
              paVar18 = (aiQuatKey *)operator_new__(uVar20 * 0x18);
              if (uVar20 != 0) {
                paVar22 = paVar18;
                do {
                  paVar22->mTime = 0.0;
                  (paVar22->mValue).w = 1.0;
                  (paVar22->mValue).x = 0.0;
                  (paVar22->mValue).y = 0.0;
                  (paVar22->mValue).z = 0.0;
                  paVar22 = paVar22 + 1;
                } while (paVar22 != paVar18 + uVar20);
              }
              paVar14->mChannels[uVar24]->mRotationKeys = paVar18;
              if ((&pmVar3->numframe)[lVar10 * 2] != 0) {
                pmVar4 = m3d->m3d_->bone;
                uVar11 = *(uint *)((long)&pmVar4->pos + (long)local_458);
                uVar21 = *(uint *)((long)&pmVar4->ori + (long)local_458);
                uVar20 = 0;
                do {
                  pmVar5 = (&pmVar3->frame)[lVar10];
                  dVar8 = (double)pmVar5[uVar20].msec / 10.0;
                  if ((ulong)pmVar5[uVar20].numtransform != 0) {
                    pmVar6 = pmVar5[uVar20].transform;
                    lVar25 = 0;
                    do {
                      if (uVar24 == *(uint *)((long)&pmVar6->boneid + lVar25)) {
                        uVar11 = *(uint *)((long)&pmVar6->pos + lVar25);
                        uVar21 = *(uint *)((long)&pmVar6->ori + lVar25);
                      }
                      lVar25 = lVar25 + 0xc;
                    } while ((ulong)pmVar5[uVar20].numtransform * 0xc != lVar25);
                  }
                  pmVar7 = m3d->m3d_->vertex;
                  paVar14->mChannels[uVar24]->mPositionKeys[uVar20].mTime = dVar8;
                  paVar14->mChannels[uVar24]->mPositionKeys[uVar20].mValue.x = pmVar7[uVar11].x;
                  paVar14->mChannels[uVar24]->mPositionKeys[uVar20].mValue.y = pmVar7[uVar11].y;
                  paVar14->mChannels[uVar24]->mPositionKeys[uVar20].mValue.z = pmVar7[uVar11].z;
                  paVar14->mChannels[uVar24]->mRotationKeys[uVar20].mTime = dVar8;
                  paVar14->mChannels[uVar24]->mRotationKeys[uVar20].mValue.w = pmVar7[uVar21].w;
                  paVar14->mChannels[uVar24]->mRotationKeys[uVar20].mValue.x = pmVar7[uVar21].x;
                  paVar14->mChannels[uVar24]->mRotationKeys[uVar20].mValue.y = pmVar7[uVar21].y;
                  paVar14->mChannels[uVar24]->mRotationKeys[uVar20].mValue.z = pmVar7[uVar21].z;
                  uVar20 = uVar20 + 1;
                } while (uVar20 < (&pmVar3->numframe)[lVar10 * 2]);
              }
              uVar24 = uVar24 + 1;
            } while (uVar24 < m3d->m3d_->numbone);
          }
          local_460->mScene->mAnimations[local_440] = paVar14;
          uVar24 = local_440 + 1;
          pmVar13 = m3d->m3d_;
        } while (uVar24 < pmVar13->numaction);
      }
    }
    return;
  }
  __assert_fail("m3d",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                ,0x206,"void Assimp::M3DImporter::importAnimations(const M3DWrapper &)");
}

Assistant:

void M3DImporter::importAnimations(const M3DWrapper &m3d) {
	unsigned int i, j, k, l, pos, ori;
	double t;
	m3da_t *a;

	ai_assert(mScene != nullptr);
	ai_assert(m3d);

	mScene->mNumAnimations = m3d->numaction;

	ASSIMP_LOG_DEBUG_F("M3D: importAnimations ", mScene->mNumAnimations);

	if (!m3d->numaction || !m3d->numbone)
		return;

	mScene->mAnimations = new aiAnimation *[m3d->numaction];
	for (i = 0; i < m3d->numaction; i++) {
		a = &m3d->action[i];
		aiAnimation *pAnim = new aiAnimation;
		pAnim->mName = aiString(std::string(a->name));
		pAnim->mDuration = ((double)a->durationmsec) / 10;
		pAnim->mTicksPerSecond = 100;
		// now we know how many bones are referenced in this animation
		pAnim->mNumChannels = m3d->numbone;
		pAnim->mChannels = new aiNodeAnim *[pAnim->mNumChannels];
		for (l = 0; l < m3d->numbone; l++) {
			unsigned int n;
			pAnim->mChannels[l] = new aiNodeAnim;
			pAnim->mChannels[l]->mNodeName = aiString(std::string(m3d->bone[l].name));
			// now n is the size of positions / orientations arrays
			pAnim->mChannels[l]->mNumPositionKeys = pAnim->mChannels[l]->mNumRotationKeys = a->numframe;
			pAnim->mChannels[l]->mPositionKeys = new aiVectorKey[a->numframe];
			pAnim->mChannels[l]->mRotationKeys = new aiQuatKey[a->numframe];
			pos = m3d->bone[l].pos;
			ori = m3d->bone[l].ori;
			for (j = n = 0; j < a->numframe; j++) {
				t = ((double)a->frame[j].msec) / 10;
				for (k = 0; k < a->frame[j].numtransform; k++) {
					if (a->frame[j].transform[k].boneid == l) {
						pos = a->frame[j].transform[k].pos;
						ori = a->frame[j].transform[k].ori;
					}
				}
				m3dv_t *v = &m3d->vertex[pos];
				m3dv_t *q = &m3d->vertex[ori];
				pAnim->mChannels[l]->mPositionKeys[j].mTime = t;
				pAnim->mChannels[l]->mPositionKeys[j].mValue.x = v->x;
				pAnim->mChannels[l]->mPositionKeys[j].mValue.y = v->y;
				pAnim->mChannels[l]->mPositionKeys[j].mValue.z = v->z;
				pAnim->mChannels[l]->mRotationKeys[j].mTime = t;
				pAnim->mChannels[l]->mRotationKeys[j].mValue.w = q->w;
				pAnim->mChannels[l]->mRotationKeys[j].mValue.x = q->x;
				pAnim->mChannels[l]->mRotationKeys[j].mValue.y = q->y;
				pAnim->mChannels[l]->mRotationKeys[j].mValue.z = q->z;
			} // foreach frame
		} // foreach bones
		mScene->mAnimations[i] = pAnim;
	}
}